

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::
       doConvert(IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  Interval local_38;
  
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  __return_storage_ptr__->m_data[0].m_lo = INFINITY;
  __return_storage_ptr__->m_data[0].m_hi = -INFINITY;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  __return_storage_ptr__->m_data[1].m_lo = INFINITY;
  __return_storage_ptr__->m_data[1].m_hi = -INFINITY;
  tcu::FloatFormat::convert(&local_38,fmt,value->m_data);
  __return_storage_ptr__->m_data[0].m_hi = local_38.m_hi;
  __return_storage_ptr__->m_data[0].m_hasNaN = local_38.m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = local_38._1_7_;
  __return_storage_ptr__->m_data[0].m_lo = local_38.m_lo;
  tcu::FloatFormat::convert(&local_38,fmt,value->m_data + 1);
  __return_storage_ptr__->m_data[1].m_hi = local_38.m_hi;
  __return_storage_ptr__->m_data[1].m_hasNaN = local_38.m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = local_38._1_7_;
  __return_storage_ptr__->m_data[1].m_lo = local_38.m_lo;
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}